

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void nn_print_requires(nn_parse_context *ctx,unsigned_long mask)

{
  long *plVar1;
  nn_option *pnVar2;
  long lVar3;
  
  pnVar2 = ctx->options;
  if (pnVar2->longname != (char *)0x0) {
    lVar3 = 0x58;
    do {
      if (((pnVar2->mask_set & mask) != 0) &&
         (fprintf(_stderr,"    --%s\n"), pnVar2->shortname != '\0')) {
        fprintf(_stderr,"    -%c\n");
      }
      plVar1 = (long *)((long)&ctx->options->longname + lVar3);
      pnVar2 = (nn_option *)((long)&ctx->options->longname + lVar3);
      lVar3 = lVar3 + 0x58;
    } while (*plVar1 != 0);
  }
  exit(1);
}

Assistant:

static void nn_print_requires (struct nn_parse_context *ctx, unsigned long mask)
{
    int i;
    struct nn_option *opt;

    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (opt->mask_set & mask) {
            fprintf (stderr, "    --%s\n", opt->longname);
            if (opt->shortname) {
                fprintf (stderr, "    -%c\n", opt->shortname);
            }
        }
    }
    exit (1);
}